

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::separatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  long lVar1;
  QWidget *pQVar2;
  
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    this->movingSeparatorPos = *pos;
    pQVar2 = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
    QBasicTimer::start(&this->separatorMoveTimer,0,1,pQVar2);
  }
  return lVar1 != 0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }